

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

bool __thiscall idx2::free_list_allocator::Alloc(free_list_allocator *this,buffer *Buf,i64 Bytes)

{
  int iVar1;
  bool Result;
  i64 Bytes_local;
  buffer *Buf_local;
  free_list_allocator *this_local;
  
  if (((Bytes < this->MinBytes) || (this->MaxBytes < Bytes)) || (this->Head == (node *)0x0)) {
    iVar1 = (**this->Parent->_vptr_allocator)(this->Parent,Buf,this->MaxBytes);
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
    Buf->Bytes = Bytes;
    Buf->Alloc = &this->super_allocator;
  }
  else {
    Buf->Data = (byte *)this->Head;
    Buf->Bytes = Bytes;
    Buf->Alloc = &this->super_allocator;
    this->Head = this->Head->Next;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
free_list_allocator::Alloc(buffer* Buf, i64 Bytes)
{
  idx2_Assert(Parent);
  if (MinBytes <= Bytes && Bytes <= MaxBytes && Head)
  {
    Buf->Data = (byte*)Head;
    Buf->Bytes = Bytes;
    Buf->Alloc = this;
    Head = Head->Next;
    return true;
  }
  bool Result = Parent->Alloc(Buf, MaxBytes);
  Buf->Bytes = Bytes;
  Buf->Alloc = this;
  return Result;
}